

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar8;
  uint uVar9;
  undefined1 *puVar10;
  int iVar11;
  char *z;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined1 local_68 [12];
  int iStack_5c;
  undefined1 *local_58;
  undefined1 *puStack_50;
  double local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = -NAN;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar11 = isDate(context,argc,argv,(DateTime *)local_68);
  if (iVar11 == 0) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    computeYMD((DateTime *)local_68);
    puVar10 = uStack_30;
    uVar9 = -local_68._8_4_;
    if (0 < (int)local_68._8_4_) {
      uVar9 = local_68._8_4_;
    }
    uVar12 = (ulong)uVar9;
    uVar1 = (uVar12 / 1000) % 10;
    uVar2 = ((ulong)uVar9 / 100) % 10;
    uVar3 = (uVar12 / 10) % 10;
    uVar8 = (ushort)uVar1;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar1 - (0xff < uVar8);
    uVar8 = (ushort)uVar2;
    bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar2 - (0xff < uVar8);
    uVar8 = (ushort)uVar3;
    bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    uVar8 = (ushort)(uVar12 % 10);
    bVar7 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar12 % 10) - (0xff < uVar8);
    local_38 = (undefined1 *)
               CONCAT17((char)(iStack_5c % 10) + '0',
                        CONCAT16((char)((long)((ulong)(uint)((int)((long)iStack_5c / 10) >> 0x1f) <<
                                               0x20 | (long)iStack_5c / 10 & 0xffffffffU) % 10) +
                                 '0',CONCAT15(0x2d,CONCAT41(CONCAT13((bVar7 != 0) * (bVar7 < 0x100)
                                                                     * bVar7 - (0xff < bVar7),
                                                                     CONCAT12((bVar6 != 0) *
                                                                              (bVar6 < 0x100) *
                                                                              bVar6 - (0xff < bVar6)
                                                                              ,CONCAT11((bVar5 != 0)
                                                                                        * (bVar5 < 
                                                  0x100) * bVar5 - (0xff < bVar5),
                                                  (bVar4 != 0) * (bVar4 < 0x100) * bVar4 -
                                                  (0xff < bVar4)))) | (uint)DAT_001eaf30,
                                                  (char)local_38))));
    uStack_30._4_4_ = SUB84(puVar10,4);
    uStack_30._0_4_ =
         (uint)CONCAT12((char)((int)local_58 % 10) + '0',
                        CONCAT11((char)((long)((ulong)(uint)((int)((long)(int)local_58 / 10) >> 0x1f
                                                            ) << 0x20 |
                                              (long)(int)local_58 / 10 & 0xffffffffU) % 10) + '0',
                                 0x2d));
    if ((int)local_68._8_4_ < 0) {
      z = (char *)&local_38;
      local_38 = (undefined1 *)CONCAT71(local_38._1_7_,0x2d);
      iVar11 = 0xb;
    }
    else {
      z = (char *)((long)&local_38 + 1);
      iVar11 = 10;
    }
    sqlite3_result_text(context,z,iVar11,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}